

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::setdashorder(Forth *this)

{
  uint local_2c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator local_20;
  uint local_18;
  uint local_14;
  Cell wid;
  SCell n;
  Forth *this_local;
  
  _wid = this;
  requireDStackDepth(this,1,"SET-ORDER");
  local_14 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (local_14 == 0xffffffff) {
    only(this);
  }
  else {
    requireDStackDepth(this,(long)(int)local_14,"SET-ORDER");
    std::vector<int,_std::allocator<int>_>::clear(&this->searchOrder);
    while (0 < (int)local_14) {
      local_14 = local_14 - 1;
      local_18 = ForthStack<unsigned_int>::getTop(&this->dStack);
      pop(this);
      local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->searchOrder)
      ;
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_20,
                 &local_28);
      local_2c = local_18;
      std::vector<int,_std::allocator<int>_>::insert
                (&this->searchOrder,local_20,(value_type_conflict4 *)&local_2c);
    }
  }
  return;
}

Assistant:

void setdashorder(){
			REQUIRE_DSTACK_DEPTH(1, "SET-ORDER");
			SCell n=dStack.getTop();pop();
			if(n==-1){
				only(); // -1 SET-ORDER and ONLY must have the same behaviour
			} else {
			REQUIRE_DSTACK_DEPTH(n, "SET-ORDER");
			searchOrder.clear();
			while(n>0){
				--n;
				Cell wid=dStack.getTop();pop();
				searchOrder.insert(searchOrder.begin(),wid);
			}
			}
		}